

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FillLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_filllike(NeuralNetworkLayer *this)

{
  bool bVar1;
  FillLikeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_filllike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_filllike(this);
    this_00 = (FillLikeLayerParams *)operator_new(0x18);
    FillLikeLayerParams::FillLikeLayerParams(this_00);
    (this->layer_).filllike_ = this_00;
  }
  return (FillLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FillLikeLayerParams* NeuralNetworkLayer::mutable_filllike() {
  if (!has_filllike()) {
    clear_layer();
    set_has_filllike();
    layer_.filllike_ = new ::CoreML::Specification::FillLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillLike)
  return layer_.filllike_;
}